

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void MOJOSHADER_glSetPixelShaderUniformB(uint idx,int *data,uint bcount)

{
  uint32 *puVar1;
  MOJOSHADER_glContext *pMVar2;
  ulong uVar3;
  ulong uVar4;
  
  pMVar2 = ctx;
  if (idx < 0x1ff) {
    uVar3 = (ulong)(0x1ff - idx);
    if (bcount <= 0x1ff - idx) {
      uVar3 = (ulong)bcount;
    }
    if ((int)uVar3 != 0) {
      uVar4 = 0;
      do {
        pMVar2->ps_reg_file_b[uVar4 + idx] = data[uVar4] != 0;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    puVar1 = &pMVar2->generation;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetPixelShaderUniformB(unsigned int idx, const int *data,
                                         unsigned int bcount)
{
    const uint maxregs = STATICARRAYLEN(ctx->ps_reg_file_b) / 4;
    if (idx < maxregs)
    {
        uint8 *wptr = ctx->ps_reg_file_b + idx;
        uint8 *endptr = wptr + minuint(maxregs - idx, bcount);
        while (wptr != endptr)
            *(wptr++) = *(data++) ? 1 : 0;
        ctx->generation++;
    } // if
}